

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::DeepTiledInputFile::setFrameBuffer(DeepTiledInputFile *this,DeepFrameBuffer *frameBuffer)

{
  _Base_ptr p_Var1;
  byte bVar2;
  byte bVar3;
  _Rb_tree_color _Var4;
  _Base_ptr p_Var5;
  size_t sVar6;
  size_t sVar7;
  double dVar8;
  PixelType PVar9;
  undefined4 uVar10;
  DeepFrameBuffer *__x;
  undefined8 __src;
  undefined8 uVar11;
  int iVar12;
  ChannelList *this_00;
  const_iterator cVar13;
  ConstIterator CVar14;
  ConstIterator CVar15;
  const_iterator cVar16;
  Slice *pSVar17;
  pointer ppTVar18;
  pointer ppTVar19;
  ostream *poVar20;
  char *pcVar21;
  ArgExc *pAVar22;
  size_t __n;
  pointer __src_00;
  ulong uVar23;
  const_iterator cVar24;
  DeepFrameBuffer *__n_00;
  Data *pDVar25;
  bool bVar26;
  ulong __n_01;
  vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
  slices;
  value_type local_1d8;
  pthread_mutex_t *local_1d0;
  DeepTiledInputFile *local_1c8;
  DeepFrameBuffer *local_1c0;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  
  local_1d0 = (pthread_mutex_t *)this->_data->_streamData;
  iVar12 = pthread_mutex_lock(local_1d0);
  if (iVar12 != 0) {
    std::__throw_system_error(iVar12);
  }
  this_00 = Header::channels(&this->_data->header);
  for (cVar13._M_node = (_Base_ptr)DeepFrameBuffer::begin(frameBuffer);
      CVar14 = DeepFrameBuffer::end(frameBuffer),
      (const_iterator)cVar13._M_node != CVar14._i._M_node;
      cVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar13._M_node)) {
    CVar15 = ChannelList::find(this_00,(char *)(cVar13._M_node + 1));
    cVar16._M_node = (_Base_ptr)ChannelList::end(this_00);
    if ((CVar15._i._M_node != (const_iterator)cVar16._M_node) &&
       ((*(_Rb_tree_color *)((long)CVar15._i._M_node + 0x124) != cVar13._M_node[10]._M_color ||
        (*(int *)((long)CVar15._i._M_node + 0x128) != *(int *)&cVar13._M_node[10].field_0x4)))) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"X and/or y subsampling factors of \"",0x23);
      poVar20 = std::operator<<((ostream *)&local_1a8,(char *)((long)CVar15._i._M_node + 0x20));
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\" channel of input file \"",0x19)
      ;
      pcVar21 = IStream::fileName(this->_data->_streamData->is);
      poVar20 = std::operator<<(poVar20,pcVar21);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar20,"\" are not compatible with the frame buffer\'s subsampling factors.",0x41)
      ;
      pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar22,(stringstream *)local_1b8);
      __cxa_throw(pAVar22,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
  }
  pSVar17 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  if (pSVar17->base == (char *)0x0) {
    pAVar22 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar22,"Invalid base pointer, please set a proper sample count slice.")
    ;
    __cxa_throw(pAVar22,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  pDVar25 = this->_data;
  pDVar25->sampleCountSliceBase = pSVar17->base;
  sVar6 = pSVar17->yStride;
  pDVar25->sampleCountXStride = pSVar17->xStride;
  pDVar25->sampleCountYStride = sVar6;
  pDVar25->sampleCountXTileCoords = (uint)pSVar17->xTileCoords;
  pDVar25->sampleCountYTileCoords = (uint)pSVar17->yTileCoords;
  local_1b8._0_8_ = (pointer)0x0;
  local_1b8._8_8_ = (pointer)0x0;
  local_1a8 = (pointer)0x0;
  cVar16._M_node = (_Base_ptr)ChannelList::begin(this_00);
  local_1c0 = frameBuffer;
  cVar13._M_node = (_Base_ptr)DeepFrameBuffer::begin(frameBuffer);
  local_1c8 = this;
  for (; CVar14 = DeepFrameBuffer::end(local_1c0), __x = local_1c0,
      (const_iterator)cVar13._M_node != CVar14._i._M_node;
      cVar13._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar13._M_node)) {
    while ((CVar15 = ChannelList::end(this_00), (const_iterator)cVar16._M_node != CVar15._i._M_node
           && (iVar12 = strcmp((char *)(cVar16._M_node + 1),(char *)(cVar13._M_node + 1)),
              iVar12 < 0))) {
      local_1d8 = (value_type)operator_new(0x40);
      _Var4 = cVar16._M_node[9]._M_color;
      local_1d8->typeInFrameBuffer = _Var4;
      local_1d8->typeInFile = _Var4;
      local_1d8->pointerArrayBase = (char *)0x0;
      local_1d8->xStride = 0;
      local_1d8->yStride = 0;
      local_1d8->sampleStride = 0;
      local_1d8->fill = false;
      local_1d8->skip = true;
      local_1d8->fillValue = 0.0;
      local_1d8->xTileCoords = 0;
      local_1d8->yTileCoords = 0;
      std::
      vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
      ::push_back((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                   *)local_1b8,&local_1d8);
      cVar16._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar16._M_node);
    }
    CVar15 = ChannelList::end(this_00);
    if (((const_iterator)cVar16._M_node == CVar15._i._M_node) ||
       (iVar12 = strcmp((char *)(cVar16._M_node + 1),(char *)(cVar13._M_node + 1)), 0 < iVar12)) {
      bVar26 = true;
    }
    else {
      bVar26 = false;
    }
    local_1d8 = (value_type)operator_new(0x40);
    p_Var5 = cVar13._M_node[9]._M_parent;
    cVar24._M_node = cVar16._M_node;
    if (bVar26 != false) {
      cVar24._M_node = cVar13._M_node;
    }
    _Var4 = cVar24._M_node[9]._M_color;
    iVar12 = *(int *)((long)&cVar13._M_node[10]._M_left + 4);
    p_Var1 = cVar13._M_node[10]._M_parent;
    bVar2 = *(byte *)&cVar13._M_node[10]._M_left;
    bVar3 = *(byte *)((long)&cVar13._M_node[10]._M_left + 1);
    local_1d8->typeInFrameBuffer = cVar13._M_node[9]._M_color;
    local_1d8->typeInFile = _Var4;
    local_1d8->pointerArrayBase = (char *)p_Var5;
    p_Var5 = cVar13._M_node[9]._M_right;
    local_1d8->xStride = (size_t)cVar13._M_node[9]._M_left;
    local_1d8->yStride = (size_t)p_Var5;
    local_1d8->sampleStride = (long)iVar12;
    local_1d8->fill = bVar26;
    local_1d8->skip = false;
    local_1d8->fillValue = (double)p_Var1;
    local_1d8->xTileCoords = (uint)bVar2;
    local_1d8->yTileCoords = (uint)bVar3;
    std::
    vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
    ::push_back((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                 *)local_1b8,&local_1d8);
    CVar15 = ChannelList::end(this_00);
    if (bVar26 == false && (const_iterator)cVar16._M_node != CVar15._i._M_node) {
      cVar16._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar16._M_node);
    }
    this = local_1c8;
  }
  for (; CVar15 = ChannelList::end(this_00), (const_iterator)cVar16._M_node != CVar15._i._M_node;
      cVar16._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar16._M_node)) {
    local_1d8 = (value_type)operator_new(0x40);
    _Var4 = cVar16._M_node[9]._M_color;
    local_1d8->typeInFrameBuffer = _Var4;
    local_1d8->typeInFile = _Var4;
    local_1d8->pointerArrayBase = (char *)0x0;
    local_1d8->xStride = 0;
    local_1d8->yStride = 0;
    local_1d8->sampleStride = 0;
    local_1d8->fill = false;
    local_1d8->skip = true;
    local_1d8->fillValue = 0.0;
    local_1d8->xTileCoords = 0;
    local_1d8->yTileCoords = 0;
    std::
    vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
    ::push_back((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                 *)local_1b8,&local_1d8);
  }
  pDVar25 = this->_data;
  __n_00 = __x;
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
  ::operator=((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)&pDVar25->frameBuffer,
              (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)__x);
  bVar26 = (__x->_sampleCounts).yTileCoords;
  (pDVar25->frameBuffer)._sampleCounts.xTileCoords = (__x->_sampleCounts).xTileCoords;
  (pDVar25->frameBuffer)._sampleCounts.yTileCoords = bVar26;
  PVar9 = (__x->_sampleCounts).type;
  uVar10 = *(undefined4 *)&(__x->_sampleCounts).field_0x4;
  pcVar21 = (__x->_sampleCounts).base;
  sVar6 = (__x->_sampleCounts).xStride;
  sVar7 = (__x->_sampleCounts).yStride;
  iVar12 = (__x->_sampleCounts).ySampling;
  dVar8 = (__x->_sampleCounts).fillValue;
  (pDVar25->frameBuffer)._sampleCounts.xSampling = (__x->_sampleCounts).xSampling;
  (pDVar25->frameBuffer)._sampleCounts.ySampling = iVar12;
  (pDVar25->frameBuffer)._sampleCounts.fillValue = dVar8;
  (pDVar25->frameBuffer)._sampleCounts.xStride = sVar6;
  (pDVar25->frameBuffer)._sampleCounts.yStride = sVar7;
  (pDVar25->frameBuffer)._sampleCounts.type = PVar9;
  *(undefined4 *)&(pDVar25->frameBuffer)._sampleCounts.field_0x4 = uVar10;
  (pDVar25->frameBuffer)._sampleCounts.base = pcVar21;
  pDVar25 = this->_data;
  ppTVar18 = (pDVar25->slices).
             super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppTVar19 = (pDVar25->slices).
             super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar19 == ppTVar18) {
    __n = 0;
  }
  else {
    uVar23 = 0;
    do {
      __n_00 = (DeepFrameBuffer *)0x40;
      operator_delete(ppTVar18[uVar23],0x40);
      uVar23 = uVar23 + 1;
      pDVar25 = this->_data;
      ppTVar18 = (pDVar25->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar19 = (pDVar25->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      __n = (long)ppTVar19 - (long)ppTVar18;
    } while (uVar23 < (ulong)((long)__n >> 3));
  }
  uVar11 = local_1b8._8_8_;
  __src = local_1b8._0_8_;
  uVar23 = local_1b8._8_8_ - local_1b8._0_8_;
  if ((ulong)((long)(pDVar25->slices).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar18) < uVar23) {
    ppTVar18 = std::
               _Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
               ::_M_allocate((_Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                              *)((long)uVar23 >> 3),(size_t)__n_00);
    if (uVar11 != __src) {
      memcpy(ppTVar18,(void *)__src,uVar23);
    }
    ppTVar19 = (pDVar25->slices).
               super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppTVar19 != (pointer)0x0) {
      operator_delete(ppTVar19,(long)(pDVar25->slices).
                                     super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppTVar19);
    }
    (pDVar25->slices).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppTVar18;
    (pDVar25->slices).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)ppTVar18 + uVar23);
  }
  else {
    if (__n < uVar23) {
      if (ppTVar19 != ppTVar18) {
        memmove(ppTVar18,(void *)local_1b8._0_8_,__n);
        ppTVar19 = (pDVar25->slices).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        __n = (long)ppTVar19 -
              (long)(pDVar25->slices).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      }
      __src_00 = (pointer)(__n + __src);
      __n_01 = uVar11 - (long)__src_00;
      if (__n_01 == 0) goto LAB_0016bb4f;
    }
    else {
      __n_01 = uVar23;
      __src_00 = (pointer)local_1b8._0_8_;
      ppTVar19 = ppTVar18;
      if (local_1b8._8_8_ == local_1b8._0_8_) goto LAB_0016bb4f;
    }
    memmove(ppTVar19,__src_00,__n_01);
  }
LAB_0016bb4f:
  (pDVar25->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(uVar23 + (long)(pDVar25->slices).
                                super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  if ((pointer)__src != (pointer)0x0) {
    operator_delete((void *)__src,(long)local_1a8 - __src);
  }
  pthread_mutex_unlock(local_1d0);
  return;
}

Assistant:

void
DeepTiledInputFile::setFrameBuffer (const DeepFrameBuffer &frameBuffer)
{
    Lock lock (*_data->_streamData);

    //
    // Set the frame buffer
    //

    //
    // Check if the new frame buffer descriptor is
    // compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin();
         j != frameBuffer.end();
         ++j)
    {
        ChannelList::ConstIterator i = channels.find (j.name());

        if (i == channels.end())
            continue;

        if (i.channel().xSampling != j.slice().xSampling ||
            i.channel().ySampling != j.slice().ySampling)
            THROW (IEX_NAMESPACE::ArgExc, "X and/or y subsampling factors "
                                "of \"" << i.name() << "\" channel "
                                "of input file \"" << fileName() << "\" are "
                                "not compatible with the frame buffer's "
                                "subsampling factors.");
    }

    //
    // Store the pixel sample count table.
    // (TODO) Support for different sampling rates?
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = sampleCountSlice.xStride;
        _data->sampleCountYStride = sampleCountSlice.yStride;
        _data->sampleCountXTileCoords = sampleCountSlice.xTileCoords;
        _data->sampleCountYTileCoords = sampleCountSlice.yTileCoords;
    }

    //
    // Initialize the slice table for readPixels().
    //

    vector<TInSliceInfo*> slices;
    ChannelList::ConstIterator i = channels.begin();

    for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin();
         j != frameBuffer.end();
         ++j)
    {
        while (i != channels.end() && strcmp (i.name(), j.name()) < 0)
        {
            //
            // Channel i is present in the file but not
            // in the frame buffer; data for channel i
            // will be skipped during readPixels().
            //

            slices.push_back (new TInSliceInfo (i.channel().type,
                                                NULL,
                                                i.channel().type,
                                                0,      // xStride
                                                0,      // yStride
                                                0,      // sampleStride
                                                false,  // fill
                                                true,   // skip
                                                0.0));  // fillValue
            ++i;
        }

        bool fill = false;

        if (i == channels.end() || strcmp (i.name(), j.name()) > 0)
        {
            //
            // Channel i is present in the frame buffer, but not in the file.
            // In the frame buffer, slice j will be filled with a default value.
            //

            fill = true;
        }

        slices.push_back (new TInSliceInfo (j.slice().type,
                                            j.slice().base,
                                            fill? j.slice().type: i.channel().type,
                                            j.slice().xStride,
                                            j.slice().yStride,
                                            j.slice().sampleStride,
                                            fill,
                                            false, // skip
                                            j.slice().fillValue,
                                            (j.slice().xTileCoords)? 1: 0,
                                            (j.slice().yTileCoords)? 1: 0));


        if (i != channels.end() && !fill)
            ++i;
    }

    // (TODO) inspect the following code. It's additional to the scanline input file.
    // Is this needed?

    while (i != channels.end())
    {
        //
        // Channel i is present in the file but not
        // in the frame buffer; data for channel i
        // will be skipped during readPixels().
        //

        slices.push_back (new TInSliceInfo (i.channel().type,
                                            NULL,
                                            i.channel().type,
                                            0, // xStride
                                            0, // yStride
                                            0, // sampleStride
                                            false,  // fill
                                            true, // skip
                                            0.0)); // fillValue
        ++i;
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size(); i++)
        delete _data->slices[i];
    _data->slices = slices;
}